

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_misc.cc
# Opt level: O1

bool __thiscall
quic::Bbr2NetworkModel::MaybeExpireMinRtt
          (Bbr2NetworkModel *this,Bbr2CongestionEvent *congestion_event)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (congestion_event->event_time).time_;
  if (((this->params_->probe_rtt_period).time_offset_ +
       (this->min_rtt_filter_).min_rtt_timestamp_.time_ <= lVar1) &&
     (lVar2 = (congestion_event->sample_min_rtt).time_offset_, lVar2 != 0x7fffffffffffffff)) {
    (this->min_rtt_filter_).min_rtt_.time_offset_ = lVar2;
    (this->min_rtt_filter_).min_rtt_timestamp_.time_ = lVar1;
    return true;
  }
  return false;
}

Assistant:

bool Bbr2NetworkModel::MaybeExpireMinRtt(
    const Bbr2CongestionEvent& congestion_event) {
  if (congestion_event.event_time <
      (MinRttTimestamp() + Params().probe_rtt_period)) {
    return false;
  }
  if (congestion_event.sample_min_rtt.IsInfinite()) {
    return false;
  }
  //QUIC_DVLOG(3) << "Replacing expired min rtt of " << min_rtt_filter_.Get()
  //              << " by " << congestion_event.sample_min_rtt << "  @ "
  //              << congestion_event.event_time;
  min_rtt_filter_.ForceUpdate(congestion_event.sample_min_rtt,
                              congestion_event.event_time);
  return true;
}